

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.h
# Opt level: O3

void __thiscall CECorrections::~CECorrections(CECorrections *this)

{
  this->_vptr_CECorrections = (_func_int **)&PTR__CECorrections_0016b4d0;
  std::vector<double,_std::allocator<double>_>::~vector(&this->ttut1_delt_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->ttut1_mjd_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->nutation_dpsi_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->nutation_deps_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->nutation_yp_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->nutation_xp_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->nutation_dut1_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->nutation_mjd_);
  std::__cxx11::string::~string((string *)&this->ttut1_file_pred_);
  std::__cxx11::string::~string((string *)&this->ttut1_file_hist_);
  std::__cxx11::string::~string((string *)&this->nutation_file_);
  return;
}

Assistant:

virtual ~CECorrections() {}